

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O2

void __thiscall luna::GC::GC(GC *this,GCObjectDeleter *obj_deleter,bool log)

{
  (this->major_traveller_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->major_traveller_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->major_traveller_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->major_traveller_).super__Function_base._M_functor + 8) = 0;
  (this->minor_traveller_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->minor_traveller_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->minor_traveller_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->minor_traveller_).super__Function_base._M_functor + 8) = 0;
  (this->gen2_).gen_ = (GCObject *)0x0;
  (this->gen2_).count_ = 0;
  (this->gen2_).threshold_count_ = 0;
  (this->gen1_).gen_ = (GCObject *)0x0;
  (this->gen1_).count_ = 0;
  (this->gen1_).threshold_count_ = 0;
  (this->gen0_).gen_ = (GCObject *)0x0;
  (this->gen0_).count_ = 0;
  (this->gen0_).threshold_count_ = 0;
  std::_Deque_base<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>::_Deque_base
            (&(this->barriered_).
              super__Deque_base<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>);
  std::function<void_(luna::GCObject_*,_unsigned_int)>::function(&this->obj_deleter_,obj_deleter);
  std::ofstream::ofstream(&this->log_stream_);
  (this->gen0_).threshold_count_ = 0x200;
  (this->gen1_).threshold_count_ = 0x200;
  if (log) {
    std::ofstream::open((char *)&this->log_stream_,0x144c5a);
  }
  return;
}

Assistant:

GC::GC(const GCObjectDeleter &obj_deleter, bool log)
        : obj_deleter_(obj_deleter)
    {
        gen0_.threshold_count_ = kGen0InitThresholdCount;
        gen1_.threshold_count_ = kGen1InitThresholdCount;

        if (log)
        {
            log_stream_.open("gc.log");
        }
    }